

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Solver.cc
# Opt level: O0

void __thiscall
Minisat::Solver::toDimacs(Solver *this,FILE *f,Clause *c,vec<int,_int> *map,Var *max)

{
  Clause *__stream;
  bool bVar1;
  uint uVar2;
  uint uVar3;
  int x;
  Var VVar4;
  Lit *pLVar5;
  char *pcVar6;
  uchar *tbs;
  size_t *siglen;
  uchar *sig;
  lbool local_35;
  uint local_34;
  Var *pVStack_30;
  int i;
  Var *max_local;
  vec<int,_int> *map_local;
  Clause *c_local;
  FILE *f_local;
  Solver *this_local;
  
  pVStack_30 = max;
  max_local = (Var *)map;
  map_local = (vec<int,_int> *)c;
  c_local = (Clause *)f;
  f_local = (FILE *)this;
  bVar1 = satisfied(this,c);
  if (!bVar1) {
    local_34 = 0;
    while( true ) {
      uVar3 = local_34;
      uVar2 = Clause::size((Clause *)map_local);
      tbs = (uchar *)(ulong)uVar2;
      if ((int)uVar2 <= (int)uVar3) break;
      pLVar5 = Clause::operator[]((Clause *)map_local,local_34);
      local_35 = value(this,(Lit)pLVar5->x);
      bVar1 = lbool::operator!=(&local_35,l_False);
      __stream = c_local;
      if (bVar1) {
        sig = (uchar *)(ulong)local_34;
        pLVar5 = Clause::operator[]((Clause *)map_local,local_34);
        uVar3 = sign((EVP_PKEY_CTX *)(ulong)(uint)pLVar5->x,sig,siglen,tbs,(size_t)max);
        pcVar6 = "";
        if ((uVar3 & 1) != 0) {
          pcVar6 = "-";
        }
        pLVar5 = Clause::operator[]((Clause *)map_local,local_34);
        x = var((Lit)pLVar5->x);
        VVar4 = mapVar(x,(vec<int,_int> *)max_local,pVStack_30);
        fprintf((FILE *)__stream,"%s%d ",pcVar6,(ulong)(VVar4 + 1));
      }
      local_34 = local_34 + 1;
    }
    fprintf((FILE *)c_local,"0\n");
  }
  return;
}

Assistant:

void Solver::toDimacs(FILE* f, Clause& c, vec<Var>& map, Var& max)
{
    if (satisfied(c)) return;

    for (int i = 0; i < c.size(); i++)
        if (value(c[i]) != l_False)
            fprintf(f, "%s%d ", sign(c[i]) ? "-" : "", mapVar(var(c[i]), map, max)+1);
    fprintf(f, "0\n");
}